

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_Backward
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  longdouble __r;
  long lVar1;
  TPZBaseMatrix *pTVar2;
  int64_t iVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t i;
  complex<long_double> sum;
  int64_t c;
  complex<long_double> pivot;
  int64_t r;
  complex<long_double> *__y;
  undefined2 uVar5;
  undefined6 in_stack_fffffffffffffe72;
  undefined1 local_148 [64];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [72];
  long local_80;
  complex<long_double> local_78;
  long local_50;
  undefined1 local_48 [40];
  long local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  lVar4 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar3 == lVar4) && ((char)in_RDI[3] != '\0')) && ((char)in_RDI[3] == '\x03')) {
    local_20 = (**(code **)(*in_RDI + 0x60))();
    while (local_20 = local_20 + -1, -1 < local_20) {
      (**(code **)(*in_RDI + 0x120))(local_48,in_RDI,local_20,local_20);
      for (local_50 = 0; lVar4 = local_50, iVar3 = TPZBaseMatrix::Cols(local_18), lVar4 < iVar3;
          local_50 = local_50 + 1) {
        __r = (longdouble)0;
        __y = SUB108(__r,0);
        uVar5 = (undefined2)((unkuint10)__r >> 0x40);
        std::complex<long_double>::complex(&local_78,__r,__r);
        local_80 = (**(code **)(*in_RDI + 0x60))();
        while (pTVar2 = local_18, lVar1 = local_20, lVar4 = local_50, local_80 = local_80 + -1,
              local_20 < local_80) {
          (**(code **)(*in_RDI + 0x120))(local_c8,in_RDI,local_20,local_80);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (local_e8,local_18,local_80,local_50);
          std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe72,uVar5),__y);
          std::complex<long_double>::operator+=
                    ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe72,uVar5),__y);
        }
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_148,local_18,local_20,local_50)
        ;
        std::operator-((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe72,uVar5),__y);
        std::operator/((complex<long_double> *)CONCAT62(in_stack_fffffffffffffe72,uVar5),__y);
        (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar2,lVar1,lVar4,local_108);
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}